

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O3

int sznet::event_greater(Timer *lhs,Timer *rhs)

{
  uint uVar1;
  int64_t iVar2;
  int64_t iVar3;
  Timestamp local_28;
  
  local_28.m_microSecondsSinceEpoch = (lhs->m_expiration).m_microSecondsSinceEpoch;
  iVar2 = Timestamp::microSecondsSinceEpoch(&local_28);
  local_28.m_microSecondsSinceEpoch = (rhs->m_expiration).m_microSecondsSinceEpoch;
  iVar3 = Timestamp::microSecondsSinceEpoch(&local_28);
  uVar1 = 0xffffffff;
  if (iVar3 <= iVar2) {
    uVar1 = (uint)(iVar2 != iVar3);
  }
  return uVar1;
}

Assistant:

int event_greater(Timer* lhs, Timer* rhs)
{
	auto key1 = lhs->expiration().microSecondsSinceEpoch();
	auto key2 = rhs->expiration().microSecondsSinceEpoch();
	if (key1 < key2)
	{
		return -1;
	}
	else if (key1 == key2)
	{
		return 0;
	}
	else
	{
		return 1;
	}
}